

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNames.c
# Opt level: O3

void Abc_NtkTransferNameIds(Abc_Ntk_t *p,Abc_Ntk_t *pNew)

{
  uint uVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  void *pvVar4;
  ulong uVar5;
  int iVar6;
  Vec_Int_t *pVVar7;
  int *__s;
  long lVar8;
  int iVar9;
  long *plVar10;
  uint uVar11;
  
  if (p->vNameIds == (Vec_Int_t *)0x0) {
    __assert_fail("p->vNameIds != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcNames.c"
                  ,0x2d8,"void Abc_NtkTransferNameIds(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  if (pNew->vNameIds != (Vec_Int_t *)0x0) {
    __assert_fail("pNew->vNameIds == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcNames.c"
                  ,0x2d9,"void Abc_NtkTransferNameIds(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  iVar9 = pNew->vObjs->nSize;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  iVar6 = 0x10;
  if (0xe < iVar9 - 1U) {
    iVar6 = iVar9;
  }
  pVVar7->nCap = iVar6;
  if (iVar6 == 0) {
    pVVar7->pArray = (int *)0x0;
    pVVar7->nSize = iVar9;
  }
  else {
    __s = (int *)malloc((long)iVar6 << 2);
    pVVar7->pArray = __s;
    pVVar7->nSize = iVar9;
    if (__s != (int *)0x0) {
      memset(__s,0,(long)iVar9 << 2);
      goto LAB_00876de2;
    }
  }
  __s = (int *)0x0;
LAB_00876de2:
  pNew->vNameIds = pVVar7;
  pVVar2 = p->vObjs;
  iVar9 = pVVar2->nSize;
  if (0 < iVar9) {
    ppvVar3 = pVVar2->pArray;
    lVar8 = 0;
    do {
      pvVar4 = ppvVar3[lVar8];
      if ((((pvVar4 != (void *)0x0) && (uVar5 = *(ulong *)((long)pvVar4 + 0x40), uVar5 != 0)) &&
          (lVar8 < p->vNameIds->nSize)) && (uVar1 = p->vNameIds->pArray[lVar8], uVar1 != 0)) {
        plVar10 = (long *)(uVar5 & 0xfffffffffffffffe);
        if ((Abc_Ntk_t *)*plVar10 != pNew) {
          __assert_fail("Abc_ObjNtk(pObjNew) == pNew",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcNames.c"
                        ,0x2e2,"void Abc_NtkTransferNameIds(Abc_Ntk_t *, Abc_Ntk_t *)");
        }
        uVar11 = *(uint *)((long)plVar10 + 0x14) & 0xf;
        if (((uVar11 != 5) && (uVar11 != 2)) ||
           ((uVar11 = *(uint *)((long)pvVar4 + 0x14) & 0xf, uVar11 == 5 || (uVar11 == 2)))) {
          iVar9 = (int)plVar10[2];
          if (((long)iVar9 < 0) || (pVVar7->nSize <= iVar9)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          __s[iVar9] = uVar1 ^ (uint)uVar5 & 1;
          iVar9 = pVVar2->nSize;
        }
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < iVar9);
  }
  return;
}

Assistant:

void Abc_NtkTransferNameIds( Abc_Ntk_t * p, Abc_Ntk_t * pNew )
{
    Abc_Obj_t * pObj, * pObjNew;
    int i;
    assert( p->vNameIds != NULL );
    assert( pNew->vNameIds == NULL );
    pNew->vNameIds = Vec_IntStart( Abc_NtkObjNumMax(pNew) );
//    Abc_NtkForEachCi( p, pObj, i )
//        printf( "%d ", Vec_IntEntry(p->vNameIds, Abc_ObjId(pObj)) );
//    printf( "\n" );
    Abc_NtkForEachObj( p, pObj, i )
        if ( pObj->pCopy && i < Vec_IntSize(p->vNameIds) && Vec_IntEntry(p->vNameIds, i) )
        {
            pObjNew = Abc_ObjRegular(pObj->pCopy);
            assert( Abc_ObjNtk(pObjNew) == pNew );
            if ( Abc_ObjIsCi(pObjNew) && !Abc_ObjIsCi(pObj) ) // do not overwrite CI name by internal node name
                continue;
            Vec_IntWriteEntry( pNew->vNameIds, Abc_ObjId(pObjNew), Vec_IntEntry(p->vNameIds, i) ^ Abc_ObjIsComplement(pObj->pCopy) );
        }
}